

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::testGroupStarting
          (RunContext *this,string *testSpec,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *_groupIndex;
  long in_RDI;
  size_t in_stack_ffffffffffffff88;
  string *_name;
  GroupInfo *in_stack_ffffffffffffffa0;
  string local_50 [80];
  
  _groupIndex = Ptr<Catch::IStreamingReporter>::operator->
                          ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x140));
  _name = local_50;
  GroupInfo::GroupInfo
            (in_stack_ffffffffffffffa0,_name,(size_t)_groupIndex,in_stack_ffffffffffffff88);
  (*(_groupIndex->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(_groupIndex,_name);
  GroupInfo::~GroupInfo((GroupInfo *)0x1840cb);
  return;
}

Assistant:

void testGroupStarting( std::string const& testSpec, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupStarting( GroupInfo( testSpec, groupIndex, groupsCount ) );
        }